

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::checkVersionDeclaration(Parser *this)

{
  bool bVar1;
  char *expected;
  int64_t iVar2;
  int64_t iVar3;
  CompileMessage local_f0;
  CompileMessage local_b8;
  int64_t local_80;
  int64_t version;
  char *local_40;
  char *local_28;
  undefined1 local_20 [8];
  CodeLocation errorContext;
  Parser *this_local;
  
  errorContext.location.data = (char *)this;
  CodeLocation::CodeLocation
            ((CodeLocation *)local_20,
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  local_28 = "#";
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x5742a3);
  expected = getHEARTFormatVersionPrefix();
  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>::
  expect<char_const*>((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                       *)this,expected);
  local_40 = "$integer32";
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,(TokenType)"$integer32");
  if (!bVar1) {
    Errors::expectedVersionNumber<>();
    CodeLocation::throwError((CodeLocation *)local_20,(CompileMessage *)&version);
  }
  CodeLocation::operator=
            ((CodeLocation *)local_20,
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  iVar2 = parseLiteralInt(this);
  local_80 = iVar2;
  if (iVar2 < 1) {
    Errors::expectedVersionNumber<>();
    CodeLocation::throwError((CodeLocation *)local_20,&local_b8);
  }
  iVar3 = getHEARTFormatVersion();
  if (iVar3 < iVar2) {
    Errors::wrongAPIVersion<>();
    CodeLocation::throwError((CodeLocation *)local_20,&local_f0);
  }
  CodeLocation::~CodeLocation((CodeLocation *)local_20);
  return;
}

Assistant:

void checkVersionDeclaration()
    {
        auto errorContext = location;
        expect (HEARTOperator::hash);
        expect (getHEARTFormatVersionPrefix());

        if (! matches (Token::literalInt32))
            errorContext.throwError (Errors::expectedVersionNumber());

        errorContext = location;
        auto version = parseLiteralInt();

        if (version <= 0)
            errorContext.throwError (Errors::expectedVersionNumber());

        if (version > getHEARTFormatVersion())
            errorContext.throwError (Errors::wrongAPIVersion());
    }